

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O1

void asmjit::v1_14::EmitterUtils::logLabelBound(BaseAssembler *self,Label *label)

{
  FormatFlags FVar1;
  Logger *pLVar2;
  ulong uVar3;
  undefined1 *puVar4;
  StringTmp<512UL> sb;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined1 *puStack_240;
  undefined1 local_238 [520];
  
  pLVar2 = (self->super_BaseEmitter)._logger;
  puStack_240 = local_238;
  uStack_250 = 0;
  local_258 = 0x20;
  local_248 = 0x207;
  local_238[0] = 0;
  FVar1 = (pLVar2->_options)._flags;
  String::_opChars((String *)&local_258,kAppend,' ',(ulong)(pLVar2->_options)._indentation._data[1])
  ;
  Formatter::formatLabel
            ((String *)&local_258,(pLVar2->_options)._flags,&self->super_BaseEmitter,
             (label->super_Operand).super_Operand_._baseId);
  String::_opChar((String *)&local_258,kAppend,':');
  finishFormattedLine((String *)&local_258,&pLVar2->_options,(uint8_t *)0x0,
                      (ulong)(FVar1 & kMachineCode) - 1,0,0,(self->super_BaseEmitter)._inlineComment
                     );
  uVar3 = uStack_250;
  puVar4 = puStack_240;
  if ((local_258 & 0xff) < 0x1f) {
    uVar3 = local_258 & 0xff;
    puVar4 = (undefined1 *)((long)&local_258 + 1);
  }
  (*pLVar2->_vptr_Logger[2])(pLVar2,puVar4,uVar3);
  String::reset((String *)&local_258);
  return;
}

Assistant:

void logLabelBound(BaseAssembler* self, const Label& label) noexcept {
  Logger* logger = self->logger();

  StringTmp<512> sb;
  size_t binSize = logger->hasFlag(FormatFlags::kMachineCode) ? size_t(0) : SIZE_MAX;

  sb.appendChars(' ', logger->indentation(FormatIndentationGroup::kLabel));
  Formatter::formatLabel(sb, logger->flags(), self, label.id());
  sb.append(':');
  finishFormattedLine(sb, logger->options(), nullptr, binSize, 0, 0, self->_inlineComment);
  logger->log(sb.data(), sb.size());
}